

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFilePathChecksum.cxx
# Opt level: O0

void __thiscall cmFilePathChecksum::cmFilePathChecksum(cmFilePathChecksum *this)

{
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_28;
  cmFilePathChecksum *this_local;
  
  local_28 = this->parentDirs;
  do {
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (local_28);
    local_28 = local_28 + 1;
  } while (local_28 != this[1].parentDirs);
  return;
}

Assistant:

cmFilePathChecksum::cmFilePathChecksum()
{
}